

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.cpp
# Opt level: O1

void __thiscall Generator::addEnums(Generator *this)

{
  QList<QByteArray> *vector;
  uint uVar1;
  long lVar2;
  FILE *pFVar3;
  QArrayData *pQVar4;
  EnumDef *pEVar5;
  qsizetype qVar6;
  qsizetype qVar7;
  EnumDef *pEVar8;
  ulong uVar9;
  char *pcVar10;
  QByteArray *val;
  char *pcVar11;
  QByteArray *u;
  EnumDef *e;
  EnumDef *u_00;
  QByteArray *pQVar12;
  
  lVar2 = (this->cdef->super_BaseDef).enumList.d.size;
  if (lVar2 != 0) {
    u_00 = (this->cdef->super_BaseDef).enumList.d.ptr;
    pEVar5 = u_00 + lVar2;
    vector = &this->strings;
    do {
      pEVar8 = (EnumDef *)&u_00->enumName;
      if ((u_00->enumName).d.ptr == (char *)0x0) {
        pEVar8 = u_00;
      }
      pcVar10 = "flag";
      if (((u_00->flags).super_QFlagsStorageHelper<QtMocConstants::EnumFlags,_4>.
           super_QFlagsStorage<QtMocConstants::EnumFlags>.i & 1) == 0) {
        pcVar10 = "enum";
      }
      pcVar11 = (u_00->name).d.ptr;
      if (pcVar11 == (char *)0x0) {
        pcVar11 = (char *)&QByteArray::_empty;
      }
      pFVar3 = (FILE *)this->out;
      qVar6 = QtPrivate::indexOf<QByteArray,QByteArray>(vector,&u_00->name,0);
      qVar7 = QtPrivate::indexOf<QByteArray,QByteArray>(vector,&pEVar8->name,0);
      fprintf(pFVar3,"        // %s \'%s\'\n        QtMocHelpers::EnumData<%s>(%d, %d,",pcVar10,
              pcVar11,pcVar11,qVar6,(int)qVar7);
      uVar1 = (u_00->flags).super_QFlagsStorageHelper<QtMocConstants::EnumFlags,_4>.
              super_QFlagsStorage<QtMocConstants::EnumFlags>.i;
      if (uVar1 == 0) {
        fwrite(" QMC::EnumFlags{}",0x11,1,(FILE *)this->out);
      }
      else {
        pcVar10 = "";
        if ((uVar1 & 1) != 0) {
          fprintf((FILE *)this->out,"%s QMC::%s","","EnumIsFlag");
          pcVar10 = " |";
        }
        if (((u_00->flags).super_QFlagsStorageHelper<QtMocConstants::EnumFlags,_4>.
             super_QFlagsStorage<QtMocConstants::EnumFlags>.i & 2) != 0) {
          fprintf((FILE *)this->out,"%s QMC::%s",pcVar10,"EnumIsScoped");
        }
      }
      if ((u_00->values).d.size == 0) {
        fwrite("),\n",3,1,(FILE *)this->out);
      }
      else {
        fwrite(").add({\n",8,1,(FILE *)this->out);
        pEVar8 = (EnumDef *)&u_00->enumName;
        if ((u_00->enumName).d.ptr == (char *)0x0) {
          pEVar8 = u_00;
        }
        pQVar4 = &((pEVar8->name).d.d)->super_QArrayData;
        pcVar10 = (pEVar8->name).d.ptr;
        if (pQVar4 != (QArrayData *)0x0) {
          LOCK();
          (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i =
               (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i + 1;
          UNLOCK();
        }
        lVar2 = (u_00->values).d.size;
        if (lVar2 != 0) {
          if (pcVar10 == (char *)0x0) {
            pcVar10 = (char *)&QByteArray::_empty;
          }
          u = (u_00->values).d.ptr;
          pQVar12 = u + lVar2;
          do {
            pFVar3 = (FILE *)this->out;
            uVar9 = QtPrivate::indexOf<QByteArray,QByteArray>(vector,u,0);
            pcVar11 = (u->d).ptr;
            if (pcVar11 == (char *)0x0) {
              pcVar11 = (char *)&QByteArray::_empty;
            }
            fprintf(pFVar3,"            { %4d, %s::%s },\n",uVar9 & 0xffffffff,pcVar10,pcVar11);
            u = u + 1;
          } while (u != pQVar12);
        }
        fwrite("        }),\n",0xc,1,(FILE *)this->out);
        if (pQVar4 != (QArrayData *)0x0) {
          LOCK();
          (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i =
               (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((pQVar4->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(pQVar4,1,0x10);
          }
        }
      }
      u_00 = u_00 + 1;
    } while (u_00 != pEVar5);
  }
  return;
}

Assistant:

void Generator::addEnums()
{
    for (const EnumDef &e : std::as_const(cdef->enumList)) {
        const QByteArray &typeName = e.enumName.isNull() ? e.name : e.enumName;
        fprintf(out, "        // %s '%s'\n"
                     "        QtMocHelpers::EnumData<%s>(%d, %d,",
                e.flags & EnumIsFlag ? "flag" : "enum", e.name.constData(),
                e.name.constData(), stridx(e.name), stridx(typeName));

        if (e.flags) {
            const char *separator = "";
            auto addFlag = [this, &separator](const char *text) {
                fprintf(out, "%s QMC::%s", separator, text);
                separator = " |";
            };
            if (e.flags & EnumIsFlag)
                addFlag("EnumIsFlag");
            if (e.flags & EnumIsScoped)
                addFlag("EnumIsScoped");
        } else {
            fprintf(out, " QMC::EnumFlags{}");
        }

        if (e.values.isEmpty()) {
            fprintf(out, "),\n");
            continue;
        }

        // add the enumerations
        fprintf(out, ").add({\n");
        QByteArray prefix = (e.enumName.isNull() ? e.name : e.enumName);
        for (const QByteArray &val : e.values) {
            fprintf(out, "            { %4d, %s::%s },\n", stridx(val),
                    prefix.constData(), val.constData());
        }

        fprintf(out, "        }),\n");
    }
}